

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileDisposal.cpp
# Opt level: O0

void printParticleCostForDebug(Particle *particle,int iterator)

{
  char *__filename;
  FILE *__stream;
  ostream *this;
  uint local_2c;
  int i;
  FILE *outFile;
  char *costFile;
  int iterator_local;
  Particle *particle_local;
  
  __filename = catStrStr(draftAddress,"cost.txt");
  __stream = fopen(__filename,"a");
  if (__stream == (FILE *)0x0) {
    this = std::operator<<((ostream *)&std::cout,"Can\'t print rep answer");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  fprintf(__stream,"iterator=%d\n",(ulong)(uint)iterator);
  for (local_2c = 0; (int)local_2c < 5; local_2c = local_2c + 1) {
    fprintf(__stream,"i=%d cost0 =%10.3f cost1 =%10.3f\n",*particle[(int)local_2c].Cost,
            particle[(int)local_2c].Cost[1],(ulong)local_2c);
  }
  fclose(__stream);
  return;
}

Assistant:

void printParticleCostForDebug(Particle * particle, int iterator){
    char *costFile = catStrStr(draftAddress, "cost.txt");
    FILE *outFile;
    outFile = fopen(costFile, "a");

    if (outFile == NULL) {
        cout << "Can't print rep answer" << endl;
        exit(-1);
    }
    fprintf(outFile, "iterator=%d\n", iterator);
    for (int i=0; i<nPop; i++){
        fprintf(outFile, "i=%d cost0 =%10.3f cost1 =%10.3f\n",
                i, particle[i].Cost[0], particle[i].Cost[1]);
    }
    fclose(outFile);
}